

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd-socket.c
# Opt level: O3

int fdsocket_try_send(FdSocket *fds)

{
  bufchain *ch;
  undefined8 in_RAX;
  size_t sVar1;
  unsigned_long data;
  int *piVar2;
  int iVar3;
  ptrlen pVar4;
  int fd;
  
  iVar3 = 0;
  if (fds->opener == (DeferredSocketOpener *)0x0) {
    ch = &fds->pending_output_data;
    sVar1 = bufchain_size(ch);
    iVar3 = 0;
    while (sVar1 != 0) {
      pVar4 = bufchain_prefix(ch);
      data = write(fds->outfd,pVar4.ptr,pVar4.len);
      noise_ultralight(NOISE_SOURCE_IOID,data);
      if ((long)data < 0) {
        piVar2 = __errno_location();
        if (*piVar2 != 0xb) {
          if (fds->pending_error != 0) {
            return 0;
          }
          fds->pending_error = *piVar2;
          queue_toplevel_callback(fdsocket_error_callback,fds);
          return 0;
        }
        break;
      }
      if (data == 0) break;
      bufchain_consume(ch,data);
      iVar3 = iVar3 + (int)data;
      sVar1 = bufchain_size(ch);
    }
    fd = (int)((ulong)in_RAX >> 0x20);
    if (fds->outgoingeof == EOF_PENDING) {
      del234(fdsocket_by_outfd,fds);
      close(fds->outfd);
      uxsel_del(fd);
      fds->outfd = -1;
      fds->outgoingeof = EOF_SENT;
    }
    sVar1 = bufchain_size(ch);
    if (sVar1 == 0) {
      uxsel_del(fd);
    }
    else {
      uxsel_set(fds->outfd,2,fdsocket_select_result_output);
    }
  }
  return iVar3;
}

Assistant:

static int fdsocket_try_send(FdSocket *fds)
{
    int sent = 0;

    if (fds->opener)
        return sent;

    while (bufchain_size(&fds->pending_output_data) > 0) {
        ssize_t ret;

        ptrlen data = bufchain_prefix(&fds->pending_output_data);
        ret = write(fds->outfd, data.ptr, data.len);
        noise_ultralight(NOISE_SOURCE_IOID, ret);
        if (ret < 0 && errno != EWOULDBLOCK) {
            if (!fds->pending_error) {
                fds->pending_error = errno;
                queue_toplevel_callback(fdsocket_error_callback, fds);
            }
            return 0;
        } else if (ret <= 0) {
            break;
        } else {
            bufchain_consume(&fds->pending_output_data, ret);
            sent += ret;
        }
    }

    if (fds->outgoingeof == EOF_PENDING) {
        del234(fdsocket_by_outfd, fds);
        close(fds->outfd);
        uxsel_del(fds->outfd);
        fds->outfd = -1;
        fds->outgoingeof = EOF_SENT;
    }

    if (bufchain_size(&fds->pending_output_data) == 0)
        uxsel_del(fds->outfd);
    else
        uxsel_set(fds->outfd, SELECT_W, fdsocket_select_result_output);

    return sent;
}